

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

bool __thiscall
icu_63::double_conversion::Bignum::ToHexString(Bignum *this,char *buffer,int buffer_size)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  char cVar7;
  char *pcVar8;
  ulong uVar9;
  
  iVar5 = this->used_digits_;
  if ((long)iVar5 != 0) {
    uVar6 = (this->bigits_).start_[(long)iVar5 + -1];
    iVar3 = 0;
    if (uVar6 != 0) {
      do {
        iVar3 = iVar3 + 1;
        bVar2 = 0xf < uVar6;
        uVar6 = uVar6 >> 4;
      } while (bVar2);
    }
    iVar3 = (this->exponent_ + iVar5) * 7 + -7 + iVar3;
    bVar2 = iVar3 < buffer_size;
    if (iVar3 < buffer_size) {
      iVar5 = iVar3 + -1;
      buffer[iVar3] = '\0';
      if (0 < this->exponent_) {
        iVar3 = 0;
        do {
          builtin_strncpy(buffer + (long)iVar5 + -3,"0000",4);
          builtin_strncpy(buffer + (long)iVar5 + -6,"0000",4);
          iVar5 = iVar5 + -7;
          iVar3 = iVar3 + 1;
        } while (iVar3 < this->exponent_);
      }
      if (this->used_digits_ < 2) {
        uVar9 = (ulong)(this->used_digits_ - 1);
      }
      else {
        lVar4 = 0;
        do {
          iVar3 = iVar5;
          uVar6 = (this->bigits_).start_[lVar4];
          pcVar8 = buffer + iVar3;
          iVar5 = 0;
          do {
            cVar7 = '7';
            if ((uVar6 & 0xf) < 10) {
              cVar7 = '0';
            }
            *pcVar8 = cVar7 + (char)(uVar6 & 0xf);
            uVar6 = uVar6 >> 4;
            iVar5 = iVar5 + 1;
            pcVar8 = pcVar8 + -1;
          } while (iVar5 != 7);
          lVar4 = lVar4 + 1;
          uVar9 = (long)this->used_digits_ - 1;
          iVar5 = iVar3 + -7;
        } while (lVar4 < (long)uVar9);
        iVar5 = iVar3 + -7;
      }
      uVar6 = (this->bigits_).start_[(int)uVar9];
      bVar2 = true;
      if (uVar6 != 0) {
        pcVar8 = buffer + iVar5;
        do {
          cVar7 = '7';
          if ((uVar6 & 0xf) < 10) {
            cVar7 = '0';
          }
          *pcVar8 = cVar7 + (char)(uVar6 & 0xf);
          pcVar8 = pcVar8 + -1;
          bVar1 = 0xf < uVar6;
          uVar6 = uVar6 >> 4;
        } while (bVar1);
      }
    }
    return bVar2;
  }
  if (1 < buffer_size) {
    buffer[0] = '0';
    buffer[1] = '\0';
    return true;
  }
  return false;
}

Assistant:

bool Bignum::ToHexString(char* buffer, int buffer_size) const {
  ASSERT(IsClamped());
  // Each bigit must be printable as separate hex-character.
  ASSERT(kBigitSize % 4 == 0);
  const int kHexCharsPerBigit = kBigitSize / 4;

  if (used_digits_ == 0) {
    if (buffer_size < 2) return false;
    buffer[0] = '0';
    buffer[1] = '\0';
    return true;
  }
  // We add 1 for the terminating '\0' character.
  int needed_chars = (BigitLength() - 1) * kHexCharsPerBigit +
      SizeInHexChars(bigits_[used_digits_ - 1]) + 1;
  if (needed_chars > buffer_size) return false;
  int string_index = needed_chars - 1;
  buffer[string_index--] = '\0';
  for (int i = 0; i < exponent_; ++i) {
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = '0';
    }
  }
  for (int i = 0; i < used_digits_ - 1; ++i) {
    Chunk current_bigit = bigits_[i];
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = HexCharOfValue(current_bigit & 0xF);
      current_bigit >>= 4;
    }
  }
  // And finally the last bigit.
  Chunk most_significant_bigit = bigits_[used_digits_ - 1];
  while (most_significant_bigit != 0) {
    buffer[string_index--] = HexCharOfValue(most_significant_bigit & 0xF);
    most_significant_bigit >>= 4;
  }
  return true;
}